

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord3.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord3::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RectangularVolumeRecord3 *this)

{
  ostream *poVar1;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  RectangularVolumeRecord3 *local_18;
  RectangularVolumeRecord3 *this_local;
  
  local_18 = this;
  this_local = (RectangularVolumeRecord3 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tCenter Location:  ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1f0,&this->m_CentLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tRectangle Length: ");
  Vector::GetAsString_abi_cxx11_(&local_210,&this->m_RecLength);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\tOrientation:      ");
  EulerAngles::GetAsString_abi_cxx11_(&local_230,&this->m_Ori);
  std::operator<<(poVar1,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString RectangularVolumeRecord3::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tCenter Location:  " << m_CentLocation.GetAsString()
       << "\tRectangle Length: " << m_RecLength.GetAsString()
       << "\tOrientation:      " << m_Ori.GetAsString();

    return ss.str();
}